

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O2

void check_small_alloc_info(small_alloc *alloc,size_t size,_Bool is_large,size_t real_size)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  undefined8 uVar2;
  undefined1 local_30 [8];
  small_alloc_info info;
  
  small_alloc_info(&::alloc,(void *)0x0,(size_t)alloc,(small_alloc_info *)local_30);
  if (local_30[0] == (_Bool)(char)size) {
    if (info._0_8_ == CONCAT71(in_register_00000011,is_large)) {
      return;
    }
    pcVar1 = "info.real_size == real_size";
    uVar2 = 0x93;
  }
  else {
    pcVar1 = "info.is_large == is_large";
    uVar2 = 0x92;
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar1,"false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",
          uVar2,"check_small_alloc_info");
  exit(-1);
}

Assistant:

static inline void
check_small_alloc_info(struct small_alloc *alloc, size_t size, bool is_large,
		       size_t real_size)
{
	struct small_alloc_info info;
	small_alloc_info(alloc, NULL, size, &info);
	fail_unless(info.is_large == is_large);
	fail_unless(info.real_size == real_size);
}